

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

void __thiscall
fasttext::DenseMatrix::averageRowsToVector
          (DenseMatrix *this,Vector *x,vector<int,_std::allocator<int>_> *rows)

{
  bool bVar1;
  Vector *this_00;
  const_iterator this_01;
  const_iterator cVar2;
  uint *puVar3;
  size_type sVar4;
  vector<int,_std::allocator<int>_> *in_RDX;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_RSI;
  DenseMatrix *in_RDI;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  const_iterator it;
  DenseMatrix *in_stack_00000108;
  vector<int,_std::allocator<int>_> *in_stack_00000110;
  Vector *in_stack_00000118;
  DenseMatrix *in_stack_00000148;
  vector<int,_std::allocator<int>_> *in_stack_00000150;
  Vector *in_stack_00000158;
  DenseMatrix *in_stack_000001c8;
  vector<int,_std::allocator<int>_> *in_stack_000001d0;
  Vector *in_stack_000001d8;
  DenseMatrix *in_stack_000004c8;
  vector<int,_std::allocator<int>_> *in_stack_000004d0;
  Vector *in_stack_000004d8;
  DenseMatrix *in_stack_000008c8;
  vector<int,_std::allocator<int>_> *in_stack_000008d0;
  Vector *in_stack_000008d8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffc0
  ;
  real a;
  
  this_00 = (Vector *)cols(in_RDI);
  if (this_00 == (Vector *)0x10) {
    averageRowsFast<16u>(in_stack_00000118,in_stack_00000110,in_stack_00000108);
  }
  else if (this_00 == (Vector *)0x20) {
    averageRowsFast<32u>(in_stack_00000158,in_stack_00000150,in_stack_00000148);
  }
  else if (this_00 == (Vector *)0x40) {
    averageRowsFast<64u>(in_stack_000001d8,in_stack_000001d0,in_stack_000001c8);
  }
  else if (this_00 == (Vector *)0x100) {
    averageRowsFast<256u>(in_stack_000004d8,in_stack_000004d0,in_stack_000004c8);
  }
  else if (this_00 == (Vector *)0x200) {
    averageRowsFast<512u>(in_stack_000008d8,in_stack_000008d0,in_stack_000008c8);
  }
  else {
    Vector::zero(this_00);
    this_01 = std::vector<int,_std::allocator<int>_>::cbegin(in_stack_ffffffffffffffb8);
    while( true ) {
      cVar2 = std::vector<int,_std::allocator<int>_>::cend(in_stack_ffffffffffffffb8);
      a = (real)((ulong)cVar2._M_current >> 0x20);
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffffc0,
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffffb8);
      auVar5 = in_ZMM0._0_16_;
      if (!bVar1) break;
      in_stack_ffffffffffffffc0 = in_RSI;
      puVar3 = (uint *)__gnu_cxx::
                       __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                       operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&stack0xffffffffffffffe0);
      (*(in_RDI->super_Matrix)._vptr_Matrix[4])(in_RDI,in_stack_ffffffffffffffc0,(ulong)*puVar3);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffe0);
    }
    sVar4 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
    vcvtusi2sd_avx512f(auVar5,sVar4);
    Vector::mul((Vector *)this_01._M_current,a);
  }
  return;
}

Assistant:

void DenseMatrix::averageRowsToVector(Vector& x, const std::vector<int32_t>& rows) const {
#if defined(__AVX512F__) || defined(__AVX__) || defined(__SSE__)
  switch (cols()) {
    case 512:
      // Maximum number that can fit all in registers on AVX512F.
      averageRowsFast<512>(x, rows, *this);
      return;
    case 256:
      averageRowsFast<256>(x, rows, *this);
      return;
    case 64:
      averageRowsFast<64>(x, rows, *this);
      return;
    case 32:
      averageRowsFast<32>(x, rows, *this);
      return;
    case 16:
      averageRowsFast<16>(x, rows, *this);
      return;
  }
#endif
  x.zero();
  for (auto it = rows.cbegin(); it != rows.cend(); ++it) {
    addRowToVector(x, *it);
  }
  x.mul(1.0 / rows.size());
}